

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadcastReceiver.h
# Opt level: O3

bool __thiscall
aeron::concurrent::broadcast::BroadcastReceiver::receiveNext(BroadcastReceiver *this)

{
  int iVar1;
  int index;
  AtomicBuffer *pAVar2;
  long lVar3;
  long lVar4;
  uint index_00;
  long lVar5;
  
  pAVar2 = this->m_buffer;
  iVar1 = this->m_tailCounterIndex;
  AtomicBuffer::boundsCheck(pAVar2,iVar1,8);
  lVar3 = *(long *)(pAVar2->m_buffer + iVar1);
  lVar4 = this->m_nextRecord;
  if (lVar4 < lVar3) {
    index_00 = this->m_mask & (uint)lVar4;
    iVar1 = this->m_capacity;
    pAVar2 = this->m_buffer;
    index = this->m_tailIntentCounterIndex;
    AtomicBuffer::boundsCheck(pAVar2,index,8);
    lVar5 = lVar4;
    if (iVar1 + lVar4 <= *(long *)(pAVar2->m_buffer + index)) {
      LOCK();
      (this->m_lappedCount).super___atomic_base<long>._M_i =
           (this->m_lappedCount).super___atomic_base<long>._M_i + 1;
      UNLOCK();
      pAVar2 = this->m_buffer;
      iVar1 = this->m_latestCounterIndex;
      AtomicBuffer::boundsCheck(pAVar2,iVar1,8);
      lVar5 = *(long *)(pAVar2->m_buffer + iVar1);
      index_00 = this->m_mask & (uint)lVar5;
    }
    this->m_cursor = lVar5;
    pAVar2 = this->m_buffer;
    AtomicBuffer::boundsCheck(pAVar2,index_00,4);
    this->m_nextRecord = (int)(*(int *)(pAVar2->m_buffer + (int)index_00) + 7U & 0xfffffff8) + lVar5
    ;
    pAVar2 = this->m_buffer;
    AtomicBuffer::boundsCheck(pAVar2,index_00 + 4,4);
    if (*(int *)(pAVar2->m_buffer + (long)(int)index_00 + 4) == -1) {
      pAVar2 = this->m_buffer;
      this->m_cursor = this->m_nextRecord;
      index_00 = 0;
      AtomicBuffer::boundsCheck(pAVar2,0,4);
      this->m_nextRecord =
           this->m_nextRecord + (long)(int)(*(int *)pAVar2->m_buffer + 7U & 0xfffffff8);
    }
    this->m_recordOffset = index_00;
  }
  return lVar4 < lVar3;
}

Assistant:

bool receiveNext()
    {
        bool isAvailable = false;
        const std::int64_t tail = m_buffer.getInt64Volatile(m_tailCounterIndex);
        std::int64_t cursor = m_nextRecord;

        if (tail > cursor)
        {
            util::index_t recordOffset = (std::int32_t)cursor & m_mask;

            if (!validate(cursor))
            {
                m_lappedCount += 1;
                cursor = m_buffer.getInt64(m_latestCounterIndex);
                recordOffset = (std::int32_t)cursor & m_mask;
            }

            m_cursor = cursor;
            m_nextRecord = cursor + util::BitUtil::align(
                m_buffer.getInt32(RecordDescriptor::lengthOffset(recordOffset)), RecordDescriptor::RECORD_ALIGNMENT);

            if (RecordDescriptor::PADDING_MSG_TYPE_ID == m_buffer.getInt32(RecordDescriptor::typeOffset(recordOffset)))
            {
                recordOffset = 0;
                m_cursor = m_nextRecord;
                m_nextRecord += util::BitUtil::align(m_buffer.getInt32(
                    RecordDescriptor::lengthOffset(recordOffset)), RecordDescriptor::RECORD_ALIGNMENT);
            }

            m_recordOffset = recordOffset;
            isAvailable = true;
        }

        return isAvailable;
    }